

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cc
# Opt level: O2

void gutil::getFileList(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *list,string *prefix,string *suffix)

{
  ulong uVar1;
  DIR *__dirp;
  dirent *pdVar2;
  long lVar3;
  IOException *this;
  string name;
  string pref;
  string dir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&dir,"",(allocator *)&pref);
  std::__cxx11::string::string((string *)&pref,(string *)prefix);
  uVar1 = std::__cxx11::string::find_last_of((char *)&pref,0x15c008);
  if (uVar1 < pref._M_string_length) {
    std::__cxx11::string::substr((ulong)&name,(ulong)&pref);
    std::__cxx11::string::operator=((string *)&dir,(string *)&name);
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::substr((ulong)&name,(ulong)&pref);
    std::__cxx11::string::operator=((string *)&pref,(string *)&name);
    std::__cxx11::string::~string((string *)&name);
  }
  if (dir._M_string_length == 0) {
    dir._M_dataplus._M_p = ".";
  }
  __dirp = opendir(dir._M_dataplus._M_p);
  if (__dirp != (DIR *)0x0) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&list->_M_t);
    pdVar2 = readdir(__dirp);
    while (pdVar2 != (dirent *)0x0) {
      std::__cxx11::string::string((string *)&name,pdVar2->d_name,(allocator *)&local_50);
      if (((suffix->_M_string_length + pref._M_string_length <= name._M_string_length) &&
          (lVar3 = std::__cxx11::string::find((string *)&name,(ulong)&pref), lVar3 == 0)) &&
         ((suffix->_M_string_length == 0 ||
          (lVar3 = std::__cxx11::string::rfind((string *)&name,(ulong)suffix),
          lVar3 == name._M_string_length - suffix->_M_string_length)))) {
        std::operator+(&local_50,&dir,&name);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)list,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
      pdVar2 = readdir(__dirp);
      std::__cxx11::string::~string((string *)&name);
    }
    closedir(__dirp);
    std::__cxx11::string::~string((string *)&pref);
    std::__cxx11::string::~string((string *)&dir);
    return;
  }
  this = (IOException *)__cxa_allocate_exception(0x28);
  std::operator+(&name,"Cannot open directory: ",&dir);
  IOException::IOException(this,&name);
  __cxa_throw(this,&IOException::typeinfo,Exception::~Exception);
}

Assistant:

void gutil::getFileList(std::set<std::string> &list, const std::string &prefix,
                        const std::string &suffix)
{
#ifdef __GNUC__
  std::string dir="", pref=prefix;
  size_t pos=pref.find_last_of("/\\");

  if (pos < pref.size())
  {
    dir=pref.substr(0, pos+1);
    pref=pref.substr(pos+1);
  }

  DIR *p;

  if (dir.size() > 0)
  {
    p=opendir(dir.c_str());
  }
  else
  {
    p=opendir(".");
  }

  if (p == 0)
  {
    throw IOException("Cannot open directory: "+dir);
  }

  list.clear();

  struct dirent *entry=readdir(p);

  while (entry != 0)
  {
    std::string name=entry->d_name;

    if (name.size() >= pref.size()+suffix.size() &&
        name.find(pref) ==  0 && (suffix.size() == 0 ||
                                  name.rfind(suffix) == name.size()-suffix.size()))
    {
      list.insert(dir+name);
    }

    entry=readdir(p);
  }

  closedir(p);
#elif defined(WIN32)
  std::string dir="";
  size_t pos=prefix.find_last_of("/\\");

  if (pos < prefix.size())
  {
    dir=prefix.substr(0, pos+1);
  }

  HANDLE p;
  WIN32_FIND_DATA data;

  list.clear();

  p=FindFirstFileA((prefix+"*"+suffix).c_str(), &data);

  if (p != INVALID_HANDLE_VALUE)
  {
    do
    {
      list.insert(dir+data.cFileName);
    }
    while (FindNextFileA(p, &data));

    FindClose(p);
  }

#else
  assert(false);
#endif
}